

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<std::__cxx11::string,std::atomic<int>,std::atomic<int>,std::__cxx11::string,bool,long,std::__cxx11::string,std::__cxx11::string>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               atomic<int> *args_1,atomic<int> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               bool *args_4,long *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  bool *in_RSI;
  atomic<int> *in_R8;
  atomic<int> *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  char *in_stack_00000018;
  ostream *in_stack_00000020;
  long *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::__cxx11::string,std::atomic<int>,std::atomic<int>,std::__cxx11::string,bool,long,std::__cxx11::string,std::__cxx11::string>
            (in_RCX,in_R8,in_R9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff28,in_RSI,in_stack_ffffffffffffff30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40);
  vformat(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}